

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::~ExtensionSet(ExtensionSet *this)

{
  bool bVar1;
  ExtensionSet *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  uint16 flat_capacity;
  KeyValue *pKVar2;
  undefined7 in_stack_ffffffffffffffe0;
  
  flat_capacity = (uint16)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  if (in_RDI->arena_ == (Arena *)0x0) {
    ForEach<google::protobuf::internal::ExtensionSet::~ForEach()::__0>(in_RDI);
    bVar1 = is_large(in_RDI);
    if (bVar1) {
      pKVar2 = (in_RDI->map_).flat;
      if (pKVar2 != (KeyValue *)0x0) {
        std::
        map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
        ::~map((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                *)0x469eeb);
        operator_delete(pKVar2);
      }
    }
    else {
      DeleteFlatMap((KeyValue *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),flat_capacity);
    }
  }
  return;
}

Assistant:

ExtensionSet::~ExtensionSet() {
  // Deletes all allocated extensions.
  if (arena_ == NULL) {
    ForEach([](int /* number */, Extension& ext) { ext.Free(); });
    if (PROTOBUF_PREDICT_FALSE(is_large())) {
      delete map_.large;
    } else {
      DeleteFlatMap(map_.flat, flat_capacity_);
    }
  }
}